

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O2

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Index *index)

{
  element_type *peVar1;
  ostream *poVar2;
  int iVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar3 = this->spaces_ + 2;
  this->spaces_ = iVar3;
  poVar2 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)iVar3);
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  poVar2 = std::operator<<(poVar2,"<index>");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_48);
  poVar2 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->spaces_ + '\x02');
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  std::operator<<(poVar2,"<name>\n");
  std::__cxx11::string::~string((string *)local_48);
  peVar1 = (index->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Expr[1])(peVar1,this);
  poVar2 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->spaces_ + '\x02');
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  std::operator<<(poVar2,"</name>\n");
  std::__cxx11::string::~string((string *)local_48);
  poVar2 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->spaces_ + '\x02');
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  std::operator<<(poVar2,"<index-expr>\n");
  std::__cxx11::string::~string((string *)local_48);
  this->spaces_ = this->spaces_ + 2;
  peVar1 = (index->index_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Expr[1])(peVar1,this);
  iVar3 = this->spaces_;
  this->spaces_ = iVar3 + -2;
  poVar2 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)iVar3);
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  std::operator<<(poVar2,"</index-expr>\n");
  std::__cxx11::string::~string((string *)local_48);
  poVar2 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->spaces_);
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  poVar2 = std::operator<<(poVar2,"</index>");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_48);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Index& index) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<index>" << std::endl;
  out_ << std::string(spaces_ + 2, ' ') << "<name>\n";
  index.name_->Accept(*this);
  out_ << std::string(spaces_ + 2, ' ') << "</name>\n";

  out_ << std::string(spaces_ + 2, ' ') << "<index-expr>\n";
  spaces_ += TAB_SIZE;
  index.index_->Accept(*this);
  spaces_ -= TAB_SIZE;
  out_ << std::string(spaces_ + 2, ' ') << "</index-expr>\n";

  out_ << std::string(spaces_, ' ') << "</index>" << std::endl;
  spaces_ -= TAB_SIZE;
  return 0;
}